

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lzma.c
# Opt level: O0

void test_write_filter_lzma(void)

{
  int iVar1;
  wchar_t wVar2;
  int r;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff48;
  archive_entry *paVar3;
  archive *paVar4;
  void *pvVar5;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar6;
  uint in_stack_ffffffffffffff54;
  archive *in_stack_ffffffffffffff58;
  archive *in_stack_ffffffffffffff60;
  archive *in_stack_ffffffffffffff68;
  undefined1 *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  archive *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff90;
  archive *in_stack_ffffffffffffff98;
  uint local_5c;
  undefined1 local_48 [56];
  archive_entry *local_10;
  archive_entry *local_8;
  
  local_48._32_8_ = 2000000;
  local_48._48_8_ = malloc(2000000);
  assertion_assert((char *)in_stack_ffffffffffffff60,
                   (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
  if ((void *)local_48._48_8_ != (void *)0x0) {
    local_48._24_8_ = (archive *)0x2710;
    local_48._40_8_ = malloc(10000);
    assertion_assert((char *)in_stack_ffffffffffffff60,
                     (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff58,
                     (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
    if ((char *)local_48._40_8_ == (char *)0x0) {
      free((void *)local_48._48_8_);
    }
    else {
      memset((void *)local_48._40_8_,0,local_48._24_8_);
      local_10 = (archive_entry *)archive_write_new();
      assertion_assert((char *)in_stack_ffffffffffffff60,
                       (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                       (wchar_t)in_stack_ffffffffffffff58,
                       (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
      archive_write_set_format_ustar(in_stack_ffffffffffffff58);
      assertion_equal_int((char *)in_stack_ffffffffffffff68,
                          (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (longlong)in_stack_ffffffffffffff58,
                          (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (longlong)local_10,(char *)0x1dcacc,in_stack_ffffffffffffff80);
      iVar1 = archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
      if (iVar1 == -0x1e) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                       ,L'A');
        wVar2 = (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
        test_skipping("lzma writing not supported on this platform");
        archive_write_free((archive *)0x1dcb10);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar2,
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                            (char *)0x1dcb3e,in_stack_ffffffffffffff80);
        free((void *)local_48._48_8_);
        free((void *)local_48._40_8_);
      }
      else {
        archive_write_set_bytes_per_block(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (longlong)local_10,(char *)0x1dcba1,in_stack_ffffffffffffff80);
        archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                            ,(int)((ulong)paVar3 >> 0x20));
        iVar1 = 0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),0,
                            (char *)0x1dcbe1,in_stack_ffffffffffffff80);
        archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                            ,iVar1);
        uVar6 = 0;
        assertion_equal_string
                  (in_stack_ffffffffffffff78,(wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                   (char *)in_stack_ffffffffffffff58,
                   (char *)((ulong)in_stack_ffffffffffffff54 << 0x20),in_stack_ffffffffffffff90,
                   (wchar_t)in_stack_ffffffffffffff98);
        archive_write_open_memory
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                   (size_t)in_stack_ffffffffffffff58,
                   (size_t *)CONCAT44(in_stack_ffffffffffffff54,uVar6));
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dcc81,in_stack_ffffffffffffff80);
        archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),
                            (int)((ulong)paVar3 >> 0x20));
        iVar1 = 0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dccc1,
                            in_stack_ffffffffffffff80);
        archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),iVar1);
        paVar3 = (archive_entry *)0x0;
        uVar6 = 0;
        assertion_equal_string
                  (in_stack_ffffffffffffff78,(wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                   (char *)in_stack_ffffffffffffff58,
                   (char *)((ulong)in_stack_ffffffffffffff54 << 0x20),in_stack_ffffffffffffff90,
                   (wchar_t)in_stack_ffffffffffffff98);
        local_8 = archive_entry_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
        archive_entry_set_filetype(local_8,0x8000);
        archive_entry_set_size(local_8,local_48._24_8_);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
          archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dcded,in_stack_ffffffffffffff80);
          in_stack_ffffffffffffff98 = (archive *)local_48._24_8_;
          archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3,0x1dce17);
          assertion_assert((char *)in_stack_ffffffffffffff60,
                           (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffff58,
                           (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
        }
        archive_entry_free((archive_entry *)0x1dce67);
        archive_write_close((archive *)0x1dce74);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dcea6,in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1dceb3);
        paVar4 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dcee1,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_read_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar4);
        archive_read_support_format_all(paVar4);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dcf56,in_stack_ffffffffffffff80);
        iVar1 = archive_read_support_filter_lzma(in_stack_ffffffffffffff58);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'a');
          test_skipping(
                       "Can\'t verify lzma writing by reading back; lzma reading not fully supported on this platform"
                       );
        }
        else {
          archive_read_support_filter_all((archive *)paVar3);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dcfd1,in_stack_ffffffffffffff80);
          archive_read_open_memory
                    ((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3,0x1dcfeb);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dd01d,in_stack_ffffffffffffff80);
          for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
            sprintf(local_48,"file%03d",(ulong)local_5c);
            archive_read_next_header
                      ((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(archive_entry **)paVar3
                      );
            paVar3 = (archive_entry *)0x0;
            wVar2 = assertion_equal_int((char *)in_stack_ffffffffffffff68,
                                        (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                        (longlong)in_stack_ffffffffffffff58,
                                        (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,
                                        (char *)0x1dd08a,in_stack_ffffffffffffff80);
            if (wVar2 == L'\0') break;
            archive_entry_pathname(paVar3);
            uVar6 = 0;
            assertion_equal_string
                      (in_stack_ffffffffffffff78,(wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20)
                       ,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                       (char *)in_stack_ffffffffffffff58,
                       (char *)((ulong)in_stack_ffffffffffffff54 << 0x20),in_stack_ffffffffffffff90,
                       (wchar_t)in_stack_ffffffffffffff98);
            in_stack_ffffffffffffff90 = (void *)(long)(int)local_48._24_8_;
            archive_entry_size(local_8);
            paVar3 = (archive_entry *)0x0;
            assertion_equal_int((char *)in_stack_ffffffffffffff68,
                                (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                (longlong)in_stack_ffffffffffffff58,
                                (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dd133
                                ,in_stack_ffffffffffffff80);
          }
          archive_read_close((archive *)0x1dd150);
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dd182,in_stack_ffffffffffffff80);
        }
        archive_read_free((archive *)0x1dd18f);
        pvVar5 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dd1bd,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),pvVar5);
        archive_write_set_format_ustar(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd232,in_stack_ffffffffffffff80);
        archive_write_set_bytes_per_block(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd276,in_stack_ffffffffffffff80);
        archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd2b5,in_stack_ffffffffffffff80);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd309,in_stack_ffffffffffffff80);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd35d,in_stack_ffffffffffffff80);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd3b1,in_stack_ffffffffffffff80);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd402,in_stack_ffffffffffffff80);
        archive_write_open_memory
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                   (size_t)in_stack_ffffffffffffff58,
                   (size_t *)CONCAT44(in_stack_ffffffffffffff54,uVar6));
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd456,in_stack_ffffffffffffff80);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          local_8 = archive_entry_new();
          assertion_assert((char *)in_stack_ffffffffffffff60,
                           (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffff58,
                           (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
          archive_entry_set_size(local_8,local_48._24_8_);
          archive_entry_set_filetype(local_8,0x8000);
          archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dd536,in_stack_ffffffffffffff80);
          in_stack_ffffffffffffff80 = (archive *)local_48._24_8_;
          archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3,0x1dd560);
          assertion_assert((char *)in_stack_ffffffffffffff60,
                           (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffff58,
                           (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
          archive_entry_free((archive_entry *)0x1dd5a0);
        }
        archive_write_close((archive *)0x1dd5bd);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd5ef,in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1dd5fc);
        paVar4 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dd62a,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_read_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar4);
        archive_read_support_format_all(paVar4);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd69f,in_stack_ffffffffffffff80);
        iVar1 = archive_read_support_filter_lzma(in_stack_ffffffffffffff58);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'\x98');
          test_skipping("lzma reading not fully supported on this platform");
        }
        else {
          archive_read_support_filter_all((archive *)paVar3);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dd71a,in_stack_ffffffffffffff80);
          archive_read_open_memory
                    ((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3,0x1dd734);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dd766,in_stack_ffffffffffffff80);
          for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
            sprintf(local_48,"file%03d",(ulong)local_5c);
            failure("Trying to read %s",local_48);
            archive_read_next_header
                      ((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(archive_entry **)paVar3
                      );
            paVar3 = local_10;
            wVar2 = assertion_equal_int((char *)in_stack_ffffffffffffff68,
                                        (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                        (longlong)in_stack_ffffffffffffff58,
                                        (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),
                                        (longlong)local_10,(char *)0x1dd7ea,
                                        in_stack_ffffffffffffff80);
            if (wVar2 == L'\0') break;
            in_stack_ffffffffffffff70 = local_48;
            archive_entry_pathname(paVar3);
            uVar6 = 0;
            assertion_equal_string
                      (in_stack_ffffffffffffff78,(wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20)
                       ,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                       (char *)in_stack_ffffffffffffff58,
                       (char *)((ulong)in_stack_ffffffffffffff54 << 0x20),in_stack_ffffffffffffff90,
                       (wchar_t)in_stack_ffffffffffffff98);
            in_stack_ffffffffffffff78 = (char *)(long)(int)local_48._24_8_;
            archive_entry_size(local_8);
            paVar3 = (archive_entry *)0x0;
            assertion_equal_int((char *)in_stack_ffffffffffffff68,
                                (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                (longlong)in_stack_ffffffffffffff58,
                                (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dd893
                                ,in_stack_ffffffffffffff80);
          }
          archive_read_close((archive *)0x1dd8b0);
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1dd8e2,in_stack_ffffffffffffff80);
        }
        archive_read_free((archive *)0x1dd8ef);
        pvVar5 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1dd91d,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),pvVar5);
        archive_write_set_format_ustar(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd992,in_stack_ffffffffffffff80);
        archive_write_set_bytes_per_block(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dd9d6,in_stack_ffffffffffffff80);
        archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dda15,in_stack_ffffffffffffff80);
        archive_write_set_filter_option
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1dda66,in_stack_ffffffffffffff80);
        archive_write_open_memory
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                   (size_t)in_stack_ffffffffffffff58,
                   (size_t *)CONCAT44(in_stack_ffffffffffffff54,uVar6));
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1ddaba,in_stack_ffffffffffffff80);
        for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
          sprintf(local_48,"file%03d",(ulong)local_5c);
          local_8 = archive_entry_new();
          assertion_assert((char *)in_stack_ffffffffffffff60,
                           (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffff58,
                           (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(char *)paVar3);
          archive_entry_set_size(local_8,local_48._24_8_);
          archive_entry_set_filetype(local_8,0x8000);
          archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1ddb9a,in_stack_ffffffffffffff80);
          failure("Writing file %s",local_48);
          in_stack_ffffffffffffff68 = (archive *)local_48._24_8_;
          archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3,0x1ddbd7);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1ddc0a,in_stack_ffffffffffffff80);
          archive_entry_free((archive_entry *)0x1ddc17);
        }
        archive_write_close((archive *)0x1ddc34);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1ddc66,in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1ddc73);
        paVar4 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1ddca1,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_read_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar4);
        archive_read_support_format_all(paVar4);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1ddd16,in_stack_ffffffffffffff80);
        archive_read_support_filter_all((archive *)paVar3);
        paVar3 = local_10;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1ddd55,in_stack_ffffffffffffff80);
        iVar1 = archive_read_support_filter_lzma(in_stack_ffffffffffffff58);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'Ô');
          test_skipping("lzma reading not fully supported on this platform");
        }
        else {
          archive_read_open_memory
                    ((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),paVar3,0x1dddab);
          paVar3 = local_10;
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1ddddd,in_stack_ffffffffffffff80);
          for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
            sprintf(local_48,"file%03d",(ulong)local_5c);
            archive_read_next_header
                      ((archive *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(archive_entry **)paVar3
                      );
            paVar3 = (archive_entry *)0x0;
            wVar2 = assertion_equal_int((char *)in_stack_ffffffffffffff68,
                                        (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                        (longlong)in_stack_ffffffffffffff58,
                                        (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,
                                        (char *)0x1dde4a,in_stack_ffffffffffffff80);
            if (wVar2 == L'\0') break;
            in_stack_ffffffffffffff58 = (archive *)local_48;
            archive_entry_pathname(paVar3);
            uVar6 = 0;
            assertion_equal_string
                      (in_stack_ffffffffffffff78,(wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20)
                       ,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                       (char *)in_stack_ffffffffffffff58,
                       (char *)((ulong)in_stack_ffffffffffffff54 << 0x20),in_stack_ffffffffffffff90,
                       (wchar_t)in_stack_ffffffffffffff98);
            in_stack_ffffffffffffff60 = (archive *)(long)(int)local_48._24_8_;
            archive_entry_size(local_8);
            paVar3 = (archive_entry *)0x0;
            assertion_equal_int((char *)in_stack_ffffffffffffff68,
                                (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                (longlong)in_stack_ffffffffffffff58,
                                (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1ddef3
                                ,in_stack_ffffffffffffff80);
          }
          archive_read_close((archive *)0x1ddf10);
          assertion_equal_int((char *)in_stack_ffffffffffffff68,
                              (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                              (longlong)in_stack_ffffffffffffff58,
                              (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                              (char *)0x1ddf42,in_stack_ffffffffffffff80);
        }
        archive_read_free((archive *)0x1ddf4f);
        pvVar5 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1ddf7d,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),pvVar5);
        archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1ddff2,in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1ddfff);
        pvVar5 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de02d,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),pvVar5);
        archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1de0a2,in_stack_ffffffffffffff80);
        archive_write_close((archive *)0x1de0af);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de0dd,
                            in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1de0ea);
        pvVar5 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de118,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),pvVar5);
        archive_write_set_format_ustar(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1de18d,in_stack_ffffffffffffff80);
        archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1de1cc,in_stack_ffffffffffffff80);
        archive_write_close((archive *)0x1de1d9);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de207,
                            in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1de214);
        pvVar5 = (void *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de242,
                            in_stack_ffffffffffffff80);
        local_10 = (archive_entry *)archive_write_new();
        assertion_assert((char *)in_stack_ffffffffffffff60,
                         (wchar_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),pvVar5);
        archive_write_set_format_ustar(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1de2b7,in_stack_ffffffffffffff80);
        archive_write_add_filter_lzma(in_stack_ffffffffffffff58);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,
                            (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1de2f6,in_stack_ffffffffffffff80);
        archive_write_open_memory
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                   (size_t)in_stack_ffffffffffffff58,
                   (size_t *)CONCAT44(in_stack_ffffffffffffff54,uVar6));
        wVar2 = (wchar_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar2,
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),(longlong)local_10,
                            (char *)0x1de34a,in_stack_ffffffffffffff80);
        archive_write_close((archive *)0x1de357);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar2,
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de385,
                            in_stack_ffffffffffffff80);
        archive_write_free((archive *)0x1de392);
        assertion_equal_int((char *)in_stack_ffffffffffffff68,wVar2,
                            (longlong)in_stack_ffffffffffffff58,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,uVar6),0,(char *)0x1de3c0,
                            in_stack_ffffffffffffff80);
        free((void *)local_48._40_8_);
        free((void *)local_48._48_8_);
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lzma)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_lzma(a);
	if (r == ARCHIVE_FATAL) {
		skipping("lzma writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_LZMA, archive_filter_code(a, 0));
	assertEqualString("lzma", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_LZMA, archive_filter_code(a, 0));
	assertEqualString("lzma", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify lzma writing by reading back;"
		    " lzma reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));


	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzma reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "0"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* It would be nice to assert that compression-level=0 produced
	 * consistently larger/smaller results than the default compression,
	 * but the results here vary a lot depending on the version of liblzma
	 * being used. */
	/* 
	failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzma reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}